

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_bit.c
# Opt level: O0

int lj_ffh_bit_bnot(lua_State *L)

{
  uint64_t uVar1;
  int local_24;
  uint64_t x;
  lua_State *plStack_10;
  CTypeID id;
  lua_State *L_local;
  
  x._4_4_ = 0;
  plStack_10 = L;
  uVar1 = lj_carith_check64(L,1,(CTypeID *)((long)&x + 4));
  if (x._4_4_ == 0) {
    local_24 = 0;
  }
  else {
    local_24 = bit_result64(plStack_10,x._4_4_,uVar1 ^ 0xffffffffffffffff);
  }
  return local_24;
}

Assistant:

LJLIB_ASM(bit_bnot)		LJLIB_REC(bit_unary IR_BNOT)
{
#if LJ_HASFFI
  CTypeID id = 0;
  uint64_t x = lj_carith_check64(L, 1, &id);
  return id ? bit_result64(L, id, ~x) : FFH_RETRY;
#else
  lj_lib_checknumber(L, 1);
  return FFH_RETRY;
#endif
}